

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserTestCase.cpp
# Opt level: O0

void __thiscall
SuiteParserTests::TestreadFixMessageFixturereadFixMessage::~TestreadFixMessageFixturereadFixMessage
          (TestreadFixMessageFixturereadFixMessage *this)

{
  TestreadFixMessageFixturereadFixMessage *this_local;
  
  ~TestreadFixMessageFixturereadFixMessage(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST_FIXTURE(readFixMessageFixture, readFixMessage)
{
  std::string readFixMsg;
  CHECK( object.readFixMessage( readFixMsg ) );
  CHECK_EQUAL( fixMsg1, readFixMsg );

  CHECK( object.readFixMessage( readFixMsg ) );
  CHECK_EQUAL( fixMsg2, readFixMsg );

  CHECK( object.readFixMessage( readFixMsg ) );
  CHECK_EQUAL( fixMsg3, readFixMsg );

  CHECK_THROW( object.readFixMessage( readFixMsg ), MessageParseError );
}